

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::DetachRequest::ParseFromArray(DetachRequest *this,void *raw,size_t size)

{
  uint uVar1;
  byte *pbVar2;
  bool bVar3;
  uint16_t uVar4;
  unsigned_short uVar5;
  size_t sVar6;
  undefined4 local_210;
  undefined2 uStack_20c;
  undefined1 uStack_20a;
  undefined4 local_1f0;
  undefined2 uStack_1ec;
  undefined1 uStack_1ea;
  undefined1 local_1e8 [8];
  Field field;
  ProtoDecoder dec;
  bool packed_error;
  size_t size_local;
  void *raw_local;
  DetachRequest *this_local;
  ParseFieldResult res_3;
  ParseFieldResult res_2;
  uint32_t local_140;
  undefined4 uStack_13c;
  ParseFieldResult res_1;
  ParseFieldResult res;
  ulong local_e8;
  uint8_t *local_e0;
  uintptr_t payload_start;
  uint64_t payload_length;
  uint64_t size_1;
  uint64_t int_value;
  uint8_t *new_pos;
  uint8_t field_type;
  uint8_t *puStack_b0;
  uint32_t field_id;
  uint8_t *next;
  uint64_t preamble;
  uint8_t *pos;
  uint64_t kFieldTypeMask;
  byte *pbStack_88;
  uint8_t kFieldTypeNumBits;
  byte *local_80;
  ulong local_78;
  uint8_t *local_70;
  uintptr_t payload_start_1;
  uint64_t payload_length_1;
  uint64_t size_2;
  uint64_t int_value_1;
  uint8_t *new_pos_1;
  uint8_t field_type_1;
  uint8_t *puStack_40;
  uint32_t field_id_1;
  uint8_t *next_1;
  uint64_t preamble_1;
  uint8_t *pos_1;
  uint64_t kFieldTypeMask_1;
  byte *pbStack_18;
  uint8_t kFieldTypeNumBits_1;
  byte *local_10;
  
  ::std::__cxx11::string::clear();
  protozero::ProtoDecoder::ProtoDecoder((ProtoDecoder *)&field.size_,raw,size);
  do {
    res_1._0_8_ = dec.end_;
    pbStack_88 = dec.begin_;
    local_140 = 0;
    local_80 = (byte *)res_1._0_8_;
    memset(&res_1.next,0,0x10);
    kFieldTypeMask._7_1_ = 3;
    pos = (uint8_t *)0x7;
    preamble = (uint64_t)local_80;
    if (local_80 < pbStack_88) {
      next = (uint8_t *)0x0;
      if (*local_80 < 0x80) {
        next = (uint8_t *)(ulong)*local_80;
        pbVar2 = local_80 + 1;
      }
      else {
        puStack_b0 = protozero::proto_utils::ParseVarInt(local_80,pbStack_88,(uint64_t *)&next);
        pbVar2 = puStack_b0;
        if ((uint8_t *)preamble == puStack_b0) goto LAB_00691788;
      }
      preamble = (uint64_t)pbVar2;
      new_pos._4_4_ = (uint)((ulong)next >> 3);
      if ((new_pos._4_4_ != 0) && (preamble < pbStack_88)) {
        new_pos._3_1_ = (byte)next & 7;
        int_value = preamble;
        size_1 = 0;
        payload_length = 0;
        switch(new_pos._3_1_) {
        case 0:
          int_value = (uint64_t)
                      protozero::proto_utils::ParseVarInt((uint8_t *)preamble,pbStack_88,&size_1);
          if (int_value != preamble) {
LAB_006916a4:
            uVar1 = new_pos._4_4_;
            res_1._0_8_ = int_value;
            uVar5 = std::numeric_limits<unsigned_short>::max();
            if (uVar5 < uVar1) {
              perfetto::base::ignore_result<char[42],unsigned_int>
                        ((char (*) [42])"Skipping field %u because its id > 0xFFFF",
                         (uint *)((long)&new_pos + 4));
              local_140 = 1;
            }
            else if (payload_length < 0x10000000) {
              local_140 = 2;
              protozero::Field::initialize
                        ((Field *)&res_1.next,(uint16_t)new_pos._4_4_,new_pos._3_1_,size_1,
                         (uint32_t)payload_length);
            }
            else {
              local_e8 = payload_length >> 10;
              perfetto::base::ignore_result<char[48],unsigned_int,unsigned_long>
                        ((char (*) [48])"Skipping field %u because it\'s too big (%lu KB)",
                         (uint *)((long)&new_pos + 4),&local_e8);
              local_140 = 1;
            }
          }
          break;
        case 1:
          int_value = preamble + 8;
          if (int_value <= pbStack_88) {
            size_1 = *(uint64_t *)preamble;
            goto LAB_006916a4;
          }
          break;
        case 2:
          int_value = (uint64_t)
                      protozero::proto_utils::ParseVarInt
                                ((uint8_t *)preamble,pbStack_88,&payload_start);
          if ((int_value != preamble) && (payload_start <= (long)pbStack_88 - int_value)) {
            payload_length = payload_start;
            local_e0 = (uint8_t *)int_value;
            size_1 = int_value;
            int_value = (uint64_t)(int_value + payload_start);
            goto LAB_006916a4;
          }
          break;
        default:
          perfetto::base::ignore_result<char[29],unsigned_char>
                    ((char (*) [29])"Invalid proto field type: %u",(uchar *)((long)&new_pos + 3));
          break;
        case 5:
          int_value = preamble + 4;
          if (int_value <= pbStack_88) {
            size_1 = (uint64_t)*(uint *)preamble;
            goto LAB_006916a4;
          }
        }
      }
    }
LAB_00691788:
    res_1.field._12_4_ = uStack_13c;
    res_1.field.size_ = local_140;
    dec.end_ = (uint8_t *)res_1._0_8_;
    if (local_140 != 1) {
      local_1e8 = (undefined1  [8])res_1.next;
      local_1f0 = (undefined4)res_1.field.int_value_;
      field.int_value_._0_4_ = local_1f0;
      uStack_1ec = (undefined2)(res_1.field.int_value_ >> 0x20);
      field.int_value_._4_2_ = uStack_1ec;
      uStack_1ea = (undefined1)(res_1.field.int_value_ >> 0x30);
      field.int_value_._6_1_ = uStack_1ea;
      do {
        bVar3 = protozero::Field::valid((Field *)local_1e8);
        if (!bVar3) {
          sVar6 = protozero::ProtoDecoder::bytes_left((ProtoDecoder *)&field.size_);
          return (bool)((sVar6 != 0 ^ 0xffU) & 1);
        }
        uVar4 = protozero::Field::id((Field *)local_1e8);
        sVar6 = std::bitset<2UL>::size(&this->_has_field_);
        if (uVar4 < sVar6) {
          uVar4 = protozero::Field::id((Field *)local_1e8);
          std::bitset<2UL>::set(&this->_has_field_,(ulong)uVar4,true);
        }
        uVar4 = protozero::Field::id((Field *)local_1e8);
        if (uVar4 == 1) {
          protozero::Field::get((Field *)local_1e8,&this->key_);
        }
        else {
          protozero::Field::SerializeAndAppendTo((Field *)local_1e8,&this->unknown_fields_);
        }
        do {
          res_3._0_8_ = dec.end_;
          pbStack_18 = dec.begin_;
          this_local._0_4_ = 0;
          local_10 = (byte *)res_3._0_8_;
          memset(&res_3.next,0,0x10);
          kFieldTypeMask_1._7_1_ = 3;
          pos_1 = (uint8_t *)0x7;
          preamble_1 = (uint64_t)local_10;
          if (local_10 < pbStack_18) {
            next_1 = (uint8_t *)0x0;
            if (*local_10 < 0x80) {
              next_1 = (uint8_t *)(ulong)*local_10;
              pbVar2 = local_10 + 1;
            }
            else {
              puStack_40 = protozero::proto_utils::ParseVarInt
                                     (local_10,pbStack_18,(uint64_t *)&next_1);
              pbVar2 = puStack_40;
              if ((uint8_t *)preamble_1 == puStack_40) goto LAB_00691c2b;
            }
            preamble_1 = (uint64_t)pbVar2;
            new_pos_1._4_4_ = (uint)((ulong)next_1 >> 3);
            if ((new_pos_1._4_4_ != 0) && (preamble_1 < pbStack_18)) {
              new_pos_1._3_1_ = (byte)next_1 & 7;
              int_value_1 = preamble_1;
              size_2 = 0;
              payload_length_1 = 0;
              switch(new_pos_1._3_1_) {
              case 0:
                int_value_1 = (uint64_t)
                              protozero::proto_utils::ParseVarInt
                                        ((uint8_t *)preamble_1,pbStack_18,&size_2);
                if (int_value_1 != preamble_1) {
LAB_00691b6e:
                  uVar1 = new_pos_1._4_4_;
                  res_3._0_8_ = int_value_1;
                  uVar5 = std::numeric_limits<unsigned_short>::max();
                  if (uVar5 < uVar1) {
                    perfetto::base::ignore_result<char[42],unsigned_int>
                              ((char (*) [42])"Skipping field %u because its id > 0xFFFF",
                               (uint *)((long)&new_pos_1 + 4));
                    this_local._0_4_ = 1;
                  }
                  else if (payload_length_1 < 0x10000000) {
                    this_local._0_4_ = 2;
                    protozero::Field::initialize
                              ((Field *)&res_3.next,(uint16_t)new_pos_1._4_4_,new_pos_1._3_1_,size_2
                               ,(uint32_t)payload_length_1);
                  }
                  else {
                    local_78 = payload_length_1 >> 10;
                    perfetto::base::ignore_result<char[48],unsigned_int,unsigned_long>
                              ((char (*) [48])"Skipping field %u because it\'s too big (%lu KB)",
                               (uint *)((long)&new_pos_1 + 4),&local_78);
                    this_local._0_4_ = 1;
                  }
                }
                break;
              case 1:
                int_value_1 = preamble_1 + 8;
                if (int_value_1 <= pbStack_18) {
                  size_2 = *(uint64_t *)preamble_1;
                  goto LAB_00691b6e;
                }
                break;
              case 2:
                int_value_1 = (uint64_t)
                              protozero::proto_utils::ParseVarInt
                                        ((uint8_t *)preamble_1,pbStack_18,&payload_start_1);
                if ((int_value_1 != preamble_1) &&
                   (payload_start_1 <= (long)pbStack_18 - int_value_1)) {
                  payload_length_1 = payload_start_1;
                  local_70 = (uint8_t *)int_value_1;
                  size_2 = int_value_1;
                  int_value_1 = (uint64_t)(int_value_1 + payload_start_1);
                  goto LAB_00691b6e;
                }
                break;
              default:
                perfetto::base::ignore_result<char[29],unsigned_char>
                          ((char (*) [29])"Invalid proto field type: %u",
                           (uchar *)((long)&new_pos_1 + 3));
                break;
              case 5:
                int_value_1 = preamble_1 + 4;
                if (int_value_1 <= pbStack_18) {
                  size_2 = (uint64_t)*(uint *)preamble_1;
                  goto LAB_00691b6e;
                }
              }
            }
          }
LAB_00691c2b:
          res_3.field._12_4_ = this_local._4_4_;
          res_3.field.size_ = (uint32_t)this_local;
          dec.end_ = (uint8_t *)res_3._0_8_;
        } while ((uint32_t)this_local == 1);
        local_210 = (undefined4)res_3.field.int_value_;
        uStack_20c = (undefined2)(res_3.field.int_value_ >> 0x20);
        uStack_20a = (undefined1)(res_3.field.int_value_ >> 0x30);
        local_1e8 = (undefined1  [8])res_3.next;
        field.int_value_._0_4_ = local_210;
        field.int_value_._4_2_ = uStack_20c;
        field.int_value_._6_1_ = uStack_20a;
      } while( true );
    }
  } while( true );
}

Assistant:

bool DetachRequest::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* key */:
        field.get(&key_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}